

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int checkurl(char *url,char *out)

{
  int iVar1;
  char *out_local;
  char *url_local;
  
  iVar1 = strcmp(out,url);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"Wanted: %s\nGot   : %s\n",out,url);
  }
  url_local._4_4_ = (uint)(iVar1 != 0);
  return url_local._4_4_;
}

Assistant:

static int checkurl(const char *url, const char *out)
{
  if(strcmp(out, url)) {
    fprintf(stderr, "Wanted: %s\nGot   : %s\n",
            out, url);
    return 1;
  }
  return 0;
}